

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O0

int prvTidyGetCharEncodingFromOptName(ctmbstr charenc)

{
  int iVar1;
  uint local_1c;
  uint i;
  ctmbstr charenc_local;
  
  local_1c = 0;
  while( true ) {
    if (0xd < local_1c) {
      return -1;
    }
    iVar1 = prvTidytmbstrcasecmp(charenc,enc2iana[local_1c].tidyOptName);
    if (iVar1 == 0) break;
    local_1c = local_1c + 1;
  }
  return enc2iana[local_1c].id;
}

Assistant:

int TY_(GetCharEncodingFromOptName)( ctmbstr charenc )
{
    uint i;

    for (i = 0; i < sizeof(enc2iana)/sizeof(enc2iana[0]); ++i)
        if (TY_(tmbstrcasecmp)(charenc, enc2iana[i].tidyOptName) == 0 )
            return enc2iana[i].id;

    return -1;
}